

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O3

ostream * operator<<(ostream *os,Population *p)

{
  ostream *poVar1;
  char *pcVar2;
  string pSafe;
  string pSize;
  string pType;
  string pCov;
  string pVel;
  char *local_d0;
  char *local_c8;
  char local_c0;
  undefined7 uStack_bf;
  char *local_b0;
  char *local_a8;
  char local_a0;
  undefined7 uStack_9f;
  char *local_90;
  long local_88;
  char local_80;
  undefined7 uStack_7f;
  char *local_70;
  char *local_68;
  char local_60;
  undefined7 uStack_5f;
  char *local_50;
  char *local_48;
  char local_40;
  undefined7 uStack_3f;
  
  local_b0 = &local_a0;
  local_a8 = (char *)0x0;
  local_a0 = '\0';
  local_d0 = &local_c0;
  local_c8 = (char *)0x0;
  local_c0 = '\0';
  local_48 = (char *)0x0;
  local_40 = '\0';
  local_68 = (char *)0x0;
  local_60 = '\0';
  local_88 = 0;
  local_80 = '\0';
  local_90 = &local_80;
  local_70 = &local_60;
  local_50 = &local_40;
  if (p->type == HERBIVORE) {
    pcVar2 = "HERBIVORE";
  }
  else {
    if (p->type != CARNIVORE) goto LAB_00125c5a;
    pcVar2 = "CARNIVORE";
  }
  std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)0x0,(ulong)pcVar2);
LAB_00125c5a:
  if ((ulong)p->size < 5) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_b0,0,local_a8,*(ulong *)(&DAT_001395a0 + (ulong)p->size * 8));
  }
  if ((ulong)p->safety < 5) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_d0,0,local_c8,*(ulong *)(&DAT_001395a0 + (ulong)p->safety * 8));
  }
  if ((ulong)p->velocity < 5) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_50,0,local_48,*(ulong *)(&DAT_001395a0 + (ulong)p->velocity * 8));
  }
  if ((ulong)p->cover < 5) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_70,0,local_68,*(ulong *)(&DAT_001395a0 + (ulong)p->cover * 8));
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,local_90,local_88);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_b0,(long)local_a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(p->name)._M_dataplus._M_p,(p->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"animalAmount ",0xd);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,p->animalAmount);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"health       ",0xd);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,p->health);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"productivity ",0xd);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,p->productivity);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"biologyDev   ",0xd);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,p->biologyDev);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"safety       ",0xd);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_d0,(long)local_c8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"velocity     ",0xd);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_50,(long)local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"cover        ",0xd);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_70,(long)local_68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"xPos         ",0xd);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,p->xPos);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"yPos         ",0xd);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,p->yPos);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"MUTATIONS",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
  std::ostream::put((char)os);
  std::ostream::flush();
  CompoundMutation::getMutation(&p->mutationTree);
  CompoundMutation::print(&p->mutationTree,os);
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
  }
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, Population &p) {
  std::string pSize, pSafe, pVel, pCov, pType;
  switch (p.GetType()) {
    case Population::HERBIVORE:pType = "HERBIVORE";
      break;
    case Population::CARNIVORE:pType = "CARNIVORE";
      break;
  }

  switch (p.GetSize()) {
    case Population::VERY_SMALL:pSize = "VERY_SMALL";
      break;
    case Population::SMALL:pSize = "SMALL";
      break;
    case Population::AVERAGE:pSize = "AVERAGE";
      break;
    case Population::BIG:pSize = "BIG";
      break;
    case Population::VERY_BIG:pSize = "VERY_BIG";
      break;
  }

  switch (p.GetSafety()) {
    case Population::VERY_SMALL:pSafe = "VERY_SMALL";
      break;
    case Population::SMALL:pSafe = "SMALL";
      break;
    case Population::AVERAGE:pSafe = "AVERAGE";
      break;
    case Population::BIG:pSafe = "BIG";
      break;
    case Population::VERY_BIG:pSafe = "VERY_BIG";
      break;
  }

  switch (p.GetVelocity()) {
    case Population::VERY_SMALL:pVel = "VERY_SMALL";
      break;
    case Population::SMALL:pVel = "SMALL";
      break;
    case Population::AVERAGE:pVel = "AVERAGE";
      break;
    case Population::BIG:pVel = "BIG";
      break;
    case Population::VERY_BIG:pVel = "VERY_BIG";
      break;
  }

  switch (p.GetCover()) {
    case Population::VERY_SMALL:pCov = "VERY_SMALL";
      break;
    case Population::SMALL:pCov = "SMALL";
      break;
    case Population::AVERAGE:pCov = "AVERAGE";
      break;
    case Population::BIG:pCov = "BIG";
      break;
    case Population::VERY_BIG:pCov = "VERY_BIG";
      break;
  }
  os << pType << " " << pSize << " " << p.GetName() << "\n"
     << "animalAmount " << p.GetAnimalAmount() << "\n"
     << "health       " << p.GetHealth() << "\n"
     << "productivity " << p.GetProductivity() << "\n"
     << "biologyDev   " << p.GetBiologyDev() << "\n"
     << "safety       " << pSafe << "\n"
     << "velocity     " << pVel << "\n"
     << "cover        " << pCov << "\n"
     << "xPos         " << p.GetXPos() << "\n"
     << "yPos         " << p.GetYPos() << "\n";
  os << "MUTATIONS" << std::endl;
  p.mutationTree.getMutation();
  p.mutationTree.print(os);
  return os;
}